

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c++
# Opt level: O2

Url * __thiscall
kj::Url::parse(Url *__return_storage_ptr__,Url *this,StringPtr url,Context context,Options options)

{
  StringPtr text;
  StringPtr url_local;
  NullableValue<kj::Url> local_2c8;
  NullableValue<kj::Url> _kj_result;
  NullableValue<kj::Url> local_f8;
  
  text.content.size_ = url.content.ptr;
  text.content.ptr = (char *)this;
  url_local.content.ptr = (char *)this;
  url_local.content.size_ = (size_t)text.content.size_;
  tryParse((Maybe<kj::Url> *)&local_2c8,text,(Context)url.content.size_,SUB42(context,0));
  kj::_::NullableValue<kj::Url>::NullableValue(&_kj_result,&local_2c8);
  kj::_::NullableValue<kj::Url>::~NullableValue(&local_2c8);
  if (_kj_result.isSet != false) {
    kj::_::NullableValue<kj::Url>::NullableValue(&local_f8,&_kj_result);
    kj::_::NullableValue<kj::Url>::~NullableValue(&_kj_result);
    Url(__return_storage_ptr__,&local_f8.field_1.value);
    kj::_::NullableValue<kj::Url>::~NullableValue(&local_f8);
    return __return_storage_ptr__;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[12],kj::StringPtr&>
            ((Fault *)&local_2c8,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/url.c++"
             ,0xa5,FAILED,"tryParse(url, context, options) != nullptr","\"invalid URL\", url",
             (char (*) [12])"invalid URL",&url_local);
  kj::_::Debug::Fault::fatal((Fault *)&local_2c8);
}

Assistant:

Url Url::parse(StringPtr url, Context context, Options options) {
  return KJ_REQUIRE_NONNULL(tryParse(url, context, options), "invalid URL", url);
}